

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O1

bool __thiscall mp::LinTerms::is_sorted(LinTerms *this)

{
  double dVar1;
  size_ty sVar2;
  ptr pdVar3;
  ptr piVar4;
  size_ty sVar5;
  
  sVar2 = (this->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_size;
  if (sVar2 == 0) {
    return true;
  }
  pdVar3 = (this->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
           super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
  dVar1 = pdVar3[sVar2 - 1];
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    piVar4 = (this->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
    do {
      sVar5 = sVar2;
      if (sVar5 == 1) {
        return true;
      }
      if (piVar4[sVar5 - 1] <= piVar4[sVar5 - 2]) break;
      dVar1 = pdVar3[sVar5 - 2];
      sVar2 = sVar5 - 1;
    } while ((dVar1 != 0.0) || (NAN(dVar1)));
    if (sVar5 == 1) {
      return true;
    }
  }
  return false;
}

Assistant:

constexpr size_ty size     (void) const noexcept { return m_size; }